

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O2

int enhance_weapon_skill(void)

{
  nh_menuitem *pnVar1;
  short sVar2;
  short sVar3;
  unsigned_short uVar4;
  ushort uVar5;
  char cVar6;
  boolean bVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  objdescr *poVar14;
  char *pcVar15;
  long lVar16;
  int iVar17;
  char *pcVar18;
  char **ppcVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  bool speedy;
  menulist menu;
  int selected [1];
  char buf [256];
  char local_138 [264];
  
  if (flags.debug == '\0') {
    speedy = false;
  }
  else {
    cVar6 = yn_function("Advance skills without practice?","yn",'n');
    speedy = cVar6 == 'y';
  }
  init_menulist(&menu);
  do {
    menu.icount = 0;
    iVar20 = 0;
    iVar24 = 0;
    for (lVar26 = 0; lVar26 != 0x2a; lVar26 = lVar26 + 1) {
      if (u.weapon_skills[lVar26].skill != '\0') {
        bVar7 = can_advance((int)lVar26,speedy);
        if (bVar7 == '\0') {
          bVar8 = could_advance((int)lVar26);
          iVar20 = iVar20 + (uint)bVar8;
        }
        else {
          iVar24 = iVar24 + 1;
        }
      }
    }
    if (iVar20 < 1) {
      iVar25 = 0;
    }
    else {
      pcVar18 = "s";
      if (iVar20 == 1) {
        pcVar18 = "";
      }
      pcVar15 = "if skill slots become available";
      if (u.ulevel < 0x1e) {
        pcVar15 = "when you\'re more experienced";
      }
      sprintf(buf,"(Skill%s flagged by \"*\" may be enhanced %s.)",pcVar18,pcVar15);
      lVar26 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar26 * 0x218);
      }
      pnVar1 = menu.items + menu.icount;
      pnVar1->id = 0;
      pnVar1->role = MI_TEXT;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,buf);
      menu.icount = menu.icount + 1;
      lVar26 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar26 * 0x218);
      }
      lVar26 = (long)menu.icount;
      menu.items[lVar26].accel = '\0';
      menu.items[lVar26].group_accel = '\0';
      menu.items[lVar26].selected = '\0';
      menu.items[lVar26].id = 0;
      menu.items[lVar26].role = MI_TEXT;
      menu.items[lVar26].caption[0] = '\0';
      iVar25 = menu.icount + 1;
      menu.icount = iVar25;
    }
    pcVar18 = "\n\n";
    if (iVar20 + iVar24 != 0 && SCARRY4(iVar20,iVar24) == iVar20 + iVar24 < 0) {
      pcVar18 = "      ";
    }
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      sVar2 = skill_ranges[lVar26].first;
      sVar3 = skill_ranges[lVar26].last;
      uVar27 = (long)sVar2;
      while ((long)uVar27 <= (long)sVar3) {
        if (uVar27 == (long)sVar2) {
          lVar16 = (long)menu.size;
          if (menu.size <= iVar25) {
            menu.size = menu.size * 2;
            menu.items = (nh_menuitem *)realloc(menu.items,lVar16 * 0x218);
            iVar25 = menu.icount;
          }
          pnVar1 = menu.items + iVar25;
          pnVar1->id = 0;
          pnVar1->role = MI_HEADING;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,skill_ranges[lVar26].name);
          iVar25 = menu.icount + 1;
          menu.icount = iVar25;
        }
        if (u.weapon_skills[uVar27].skill == '\0') {
          uVar27 = uVar27 + 1;
        }
        else {
          iVar20 = (int)uVar27;
          bVar7 = can_advance(iVar20,speedy);
          pcVar15 = "";
          if (bVar7 == '\0') {
            bVar7 = could_advance(iVar20);
            pcVar15 = "  * ";
            if (bVar7 == '\0') {
              pcVar15 = pcVar18 + 2;
            }
          }
          buf[0] = ' ';
          buf[1] = '\0';
          pcVar11 = eos(buf);
          if ((0x2ffd7bfeUL >> (uVar27 & 0x3f) & 1) == 0) {
            if (uVar27 == 0x25) {
              uVar13 = (ulong)(urole.malenum == 0x160 || urole.malenum == 0x165);
              ppcVar19 = barehands_or_martial;
            }
            else {
              uVar13 = (ulong)(uint)-(int)skill_names_indices[uVar27];
              ppcVar19 = odd_skill_names;
            }
            poVar14 = (objdescr *)(ppcVar19 + uVar13);
          }
          else {
            poVar14 = obj_descr + objects[skill_names_indices[uVar27]].oc_name_idx;
          }
          sprintf(pcVar11,"%s%s",pcVar15,poVar14->oc_name);
          uVar9 = skill_crosstrain_bonus(iVar20);
          if ((1 < (int)uVar9) &&
             (u.weapon_skills[uVar27].skill < u.weapon_skills[uVar27].max_skill)) {
            pcVar15 = eos(buf);
            sprintf(pcVar15," (x%d)",(ulong)uVar9);
          }
          pcVar15 = eos(buf);
          pcVar11 = skill_level_name(u.weapon_skills[uVar27].skill);
          pcVar12 = skill_level_name(u.weapon_skills[uVar27].max_skill);
          sprintf(pcVar15,"\t[%s\t/ %s]",pcVar11,pcVar12);
          if (u.weapon_skills[uVar27].skill == u.weapon_skills[uVar27].max_skill) {
            pcVar15 = eos(buf);
            builtin_strncpy(pcVar15,"\t   MAX",8);
          }
          else {
            uVar4 = u.weapon_skills[uVar27].advance;
            pcVar15 = eos(buf);
            if (uVar4 == 0) {
              builtin_strncpy(pcVar15,"\t      ",8);
            }
            else {
              cVar6 = u.weapon_skills[uVar27].skill;
              if (cVar6 == '\0') {
                uVar13 = 0;
              }
              else {
                iVar17 = cVar6 * 0x14;
                iVar21 = 0;
                for (iVar25 = cVar6 + -2; iVar25 + 2 < (int)u.weapon_skills[uVar27].max_skill;
                    iVar25 = iVar25 + 1) {
                  uVar5 = u.weapon_skills[uVar27].advance;
                  iVar23 = 100 << ((byte)iVar25 + 1 & 0x1f);
                  if (iVar20 - 0x1eU < 7) {
                    iVar23 = (iVar25 + 2) * iVar17;
                  }
                  if ((int)(uint)uVar5 < iVar23) {
                    if (iVar25 == -1) {
                      iVar22 = 0;
                    }
                    else {
                      iVar22 = 100 << ((byte)iVar25 & 0x1f);
                      if (iVar20 - 0x1eU < 7) {
                        iVar22 = (iVar17 + -0x14) * (iVar25 + 1);
                      }
                    }
                    iVar25 = (int)(((uint)uVar5 - iVar22) * 100) / (iVar23 - iVar22);
                    if (99 < iVar25) {
                      iVar25 = 100;
                    }
                    uVar13 = (ulong)(uint)(iVar25 - iVar21);
                    goto LAB_00270378;
                  }
                  iVar17 = iVar17 + 0x14;
                  iVar21 = iVar21 + -100;
                }
                uVar13 = (ulong)(uint)-iVar21;
              }
LAB_00270378:
              sprintf(pcVar15,"\t%5d%%",uVar13);
            }
          }
          if (flags.debug != '\0') {
            pcVar15 = eos(buf);
            cVar6 = u.weapon_skills[uVar27].skill;
            uVar9 = 100 << (cVar6 - 1U & 0x1f);
            if (iVar20 - 0x1eU < 7) {
              uVar9 = (int)cVar6 * (int)cVar6 * 0x14;
            }
            sprintf(pcVar15,"/%5d(%4d)",(ulong)u.weapon_skills[uVar27].advance,(ulong)uVar9);
          }
          bVar7 = could_advance(iVar20);
          if (((bVar7 != '\0') || (bVar7 = can_advance(iVar20,speedy), bVar7 != '\0')) &&
             (!(bool)(speedy & flags.debug != '\0'))) {
            pcVar15 = eos(buf);
            uVar9 = slots_required(iVar20);
            sprintf(pcVar15," (%d to advance)",(ulong)uVar9);
          }
          bVar7 = can_advance(iVar20,speedy);
          uVar27 = uVar27 + 1;
          iVar20 = (int)uVar27;
          if (bVar7 == '\0') {
            iVar20 = 0;
          }
          lVar16 = (long)menu.size;
          if (menu.size <= menu.icount) {
            menu.size = menu.size * 2;
            menu.items = (nh_menuitem *)realloc(menu.items,lVar16 * 0x218);
          }
          pnVar1 = menu.items + menu.icount;
          pnVar1->id = iVar20;
          pnVar1->role = MI_NORMAL;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,buf);
          iVar25 = menu.icount + 1;
          menu.icount = iVar25;
        }
      }
    }
    pcVar18 = "Current skills:";
    if (0 < iVar24) {
      pcVar18 = "Pick a skill to advance:";
    }
    strcpy(buf,pcVar18);
    if ((speedy & flags.debug != '\0') == 0) {
      pcVar18 = eos(buf);
      pcVar15 = "s";
      if (u.weapon_slots == 1) {
        pcVar15 = "";
      }
      sprintf(pcVar18,"  (%d slot%s available)",(ulong)(uint)u.weapon_slots,pcVar15);
      iVar25 = menu.icount;
    }
    iVar20 = display_menu(menu.items,iVar25,buf,(uint)(iVar24 != 0),selected);
    if (iVar20 == 1) {
      lVar26 = (long)selected[0];
      uVar27 = lVar26 - 1;
      sVar2 = *(short *)(&DAT_002c3a3e + lVar26 * 2);
      uVar9 = (uint)uVar27;
      if ((0x2ffd7bfeUL >> (uVar27 & 0x3f) & 1) == 0) {
        if (uVar9 == 0x25) {
          uVar13 = (ulong)(urole.malenum == 0x160 || urole.malenum == 0x165);
          ppcVar19 = barehands_or_martial;
        }
        else {
          uVar13 = (ulong)(uint)-(int)sVar2;
          ppcVar19 = odd_skill_names;
        }
        poVar14 = (objdescr *)(ppcVar19 + uVar13);
      }
      else {
        poVar14 = obj_descr + objects[sVar2].oc_name_idx;
      }
      pcVar18 = poVar14->oc_name;
      pcVar15 = skill_level_name(u.weapon_skills[lVar26 + -1].skill + '\x01');
      uVar10 = slots_required(uVar9);
      pcVar12 = "s";
      pcVar11 = "s";
      if (uVar10 == 1) {
        pcVar11 = "";
      }
      if (u.weapon_slots == 1) {
        pcVar12 = "";
      }
      snprintf(local_138,0x100,"Enhance %s to %s for %d slot%s (%d slot%s left)?",pcVar18,pcVar15,
               (ulong)uVar10,pcVar11,(ulong)(uint)u.weapon_slots,pcVar12);
      cVar6 = yn_function(local_138,"yn",'n');
      if (cVar6 == 'y') {
        iVar20 = slots_required(uVar9);
        u.weapon_slots = u.weapon_slots - iVar20;
        u.weapon_skills[lVar26 + -1].skill = u.weapon_skills[lVar26 + -1].skill + '\x01';
        lVar16 = (long)u.skills_advanced;
        u.skills_advanced = u.skills_advanced + 1;
        u.skill_record[lVar16] = (byte)uVar27;
        pcVar18 = "most";
        if (u.weapon_skills[lVar26 + -1].skill < u.weapon_skills[lVar26 + -1].max_skill) {
          pcVar18 = "more";
        }
        if ((0x2ffd7bfeUL >> ((byte)uVar27 & 0x3f) & 1) == 0) {
          if (uVar9 == 0x25) {
            poVar14 = (objdescr *)
                      (barehands_or_martial + (urole.malenum == 0x160 || urole.malenum == 0x165));
          }
          else {
            poVar14 = (objdescr *)(odd_skill_names + (uint)-(int)sVar2);
          }
        }
        else {
          poVar14 = obj_descr + objects[sVar2].oc_name_idx;
        }
        pline("You are now %s skilled in %s.",pcVar18,poVar14->oc_name);
        if (((uVar9 & 0xfffffffe) == 0x28) && (find_ac(), uVar9 == 0x28)) {
          encumber_msg();
        }
      }
      iVar20 = 0;
      do {
        if (iVar20 == 0x2a) goto LAB_002707dc;
        bVar7 = can_advance(iVar20,speedy);
        iVar20 = iVar20 + 1;
      } while (bVar7 == '\0');
      iVar20 = 1;
      if (cVar6 == 'y' && speedy == false) {
        pline("You feel you could be more dangerous!");
        iVar20 = 1;
      }
    }
  } while ((speedy & 0 < iVar20) != 0);
LAB_002707dc:
  free(menu.items);
  return 0;
}

Assistant:

int enhance_weapon_skill(void)
{
    int pass, i, n, crosstrain, id,
	to_advance, eventually_advance, selected[1];
    char buf[BUFSZ];
    const char *prefix;
    struct menulist menu;
    boolean speedy = FALSE;

    if (wizard && yn("Advance skills without practice?") == 'y')
	speedy = TRUE;

    init_menulist(&menu);
    do {
	menu.icount = 0;
	/* count skills that can advance */
	to_advance = eventually_advance = 0;
	for (i = 0; i < P_NUM_SKILLS; i++) {
	    if (P_RESTRICTED(i))
		continue;
	    if (can_advance(i, speedy)) to_advance++;
	    else if (could_advance(i)) eventually_advance++;
	}

	/* start with a legend if any entries will be annotated
	    with "*" below */
	if (eventually_advance > 0) {
	    sprintf(buf,
		    "(Skill%s flagged by \"*\" may be enhanced %s.)",
		    plur(eventually_advance),
		    (u.ulevel < MAXULEV) ?
			"when you're more experienced" :
			"if skill slots become available");
	    add_menutext(&menu, buf);
	    add_menutext(&menu, "");
	}

	/* List the skills, making ones that could be advanced
	    selectable.  List the miscellaneous skills first.
	    Possible future enhancement:  list spell skills before
	    weapon skills for spellcaster roles. */
	for (pass = 0; pass < SIZE(skill_ranges); pass++)
	    for (i = skill_ranges[pass].first;
		i <= skill_ranges[pass].last; i++) {
	    /* Print headings for skill types */
	    if (i == skill_ranges[pass].first)
		add_menuheading(&menu, skill_ranges[pass].name);

	    if (P_RESTRICTED(i))
		continue;
	    /*
	     * The 12 is the longest skill level name.
	     * The "    " is room for a selection letter and dash, "a - ".
	     */
	    if (can_advance(i, speedy))
		prefix = "";	/* will be preceded by menu choice */
	    else if (could_advance(i))
		prefix = "  * ";
	    else
		prefix = (to_advance + eventually_advance > 0) ? "    " : "";
	    strcpy(buf, " ");
	    sprintf(eos(buf), "%s%s", prefix, P_NAME(i));
	    crosstrain = skill_crosstrain_bonus(i);
	    if (crosstrain > 1 && P_SKILL(i) < P_MAX_SKILL(i))
		sprintf(eos(buf), " (x%d)", crosstrain);

	    sprintf(eos(buf), "\t[%s\t/ %s]",
		    skill_level_name(P_SKILL(i)),
		    skill_level_name(P_MAX_SKILL(i)));

	    if (P_SKILL(i) == P_MAX_SKILL(i)) {
		sprintf(eos(buf), "\t   MAX");
	    } else if (P_ADVANCE(i) == 0) {
		sprintf(eos(buf), "\t      ");
	    } else {
		sprintf(eos(buf), "\t%5d%%", skill_training_percent(i));
	    }
	    if (wizard) {
		sprintf(eos(buf), "/%5d(%4d)",
			P_ADVANCE(i), practice_needed_to_advance(i, P_SKILL(i)));
	    }

	    if ((could_advance(i) || can_advance(i, speedy)) && !(wizard && speedy))
		sprintf(eos(buf), " (%d to advance)", slots_required(i));
	    id = can_advance(i, speedy) ? i+1 : 0;
	    add_menuitem(&menu, id, buf, 0, FALSE);
	}

	strcpy(buf, (to_advance > 0) ? "Pick a skill to advance:" :
					"Current skills:");
	if (!(wizard && speedy)) {
	    sprintf(eos(buf), "  (%d slot%s available)",
		    u.weapon_slots, plur(u.weapon_slots));
	}
	n = display_menu(menu.items, menu.icount, buf,
			    to_advance ? PICK_ONE : PICK_NONE, selected);
	if (n == 1) {
	    boolean skill_advanced;
	    n = selected[0] - 1;	/* get item selected */
	    skill_advanced = skill_advance(n);
	    /* check for more skills able to advance, if so then .. */
	    for (n = i = 0; i < P_NUM_SKILLS; i++) {
		if (can_advance(i, speedy)) {
		    if (skill_advanced && !speedy)
			pline("You feel you could be more dangerous!");
		    n++;
		    break;
		}
	    }
	}
    } while (speedy && n > 0);
    
    free(menu.items);
    return 0;
}